

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_8.cpp
# Opt level: O1

int main(void)

{
  long *plVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  long lVar8;
  int *piVar9;
  int n;
  int local_2c;
  
  std::istream::operator>>((istream *)&std::cin,&local_2c);
  num[0] = local_2c;
  lVar4 = 1;
  lVar8 = 0;
  piVar9 = num;
  while( true ) {
    iVar3 = 0;
    if (local_2c != 0) {
      iVar3 = 0;
      piVar6 = digital;
      iVar5 = local_2c;
      do {
        *piVar6 = iVar5 % 10;
        uVar7 = iVar5 + 9;
        piVar6 = piVar6 + 1;
        iVar3 = iVar3 + 1;
        iVar5 = iVar5 / 10;
      } while (0x12 < uVar7);
    }
    if (digital[0] == (&DAT_0010504c)[iVar3]) break;
    iVar5 = 0;
    iVar3 = local_2c;
    if (local_2c != 0) {
      do {
        iVar5 = iVar3 % 10 + iVar5 * 10;
        uVar7 = iVar3 + 9;
        iVar3 = iVar3 / 10;
      } while (0x12 < uVar7);
    }
    local_2c = iVar5 + local_2c;
    num[lVar4] = local_2c;
    lVar4 = lVar4 + 1;
    lVar8 = lVar8 + -1;
  }
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar4 + -1);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  do {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar9);
    if (lVar8 == 0) {
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"--->",4);
    }
    lVar8 = lVar8 + 1;
    piVar9 = piVar9 + 1;
  } while (lVar8 != 1);
  return 0;
}

Assistant:

int main()
{
    int n,cnt = 0;  //cnt来记录转换加了多少次
    cin  >> n;
    num[cnt++] = n;     //先把这个数存在num当中
    while (!judge(n))
    {
        n += reset(n);
        num[cnt++] = n;
    }
    cout << cnt -1 <<endl;  //cnt-1,要排除这个数本身，才是转换的次数
    for (int i = 0; i < cnt; ++i) {
        if(i != cnt-1 )
        {
            cout << num[i] << "--->";
        }else
            cout << num[i] <<endl;
    }
    return 0;
}